

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O1

void Rnm_ManJustifyPropFanout_rec(Rnm_Man_t *p,Gia_Obj_t *pObj,int f,Vec_Int_t *vSelect)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Rnm_Obj_t RVar3;
  int iVar4;
  Rnm_Obj_t RVar5;
  Rnm_Obj_t *pRVar6;
  int *piVar7;
  bool bVar8;
  Gia_Obj_t *pGVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  Gia_Man_t *pGVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  
  while( true ) {
    if (((~*(ulong *)pObj & 0x1fffffff1fffffff) != 0) && (pObj->Value == 0)) goto LAB_00573265;
    uVar15 = pObj->Value;
    if (p->nObjsFrame <= (int)uVar15) goto LAB_00573227;
    if ((f < 0) || (p->pCex->iFrame < f)) goto LAB_00573208;
    iVar11 = p->nObjsFrame * f;
    pRVar6 = p->pObjs;
    if (((uint)pRVar6[(long)iVar11 + (ulong)uVar15] & 2) != 0) {
      __assert_fail("pRnm->fVisit == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                    ,0x1db,
                    "void Rnm_ManJustifyPropFanout_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)")
      ;
    }
    pRVar6[(long)iVar11 + (ulong)uVar15] =
         (Rnm_Obj_t)((uint)pRVar6[(long)iVar11 + (ulong)uVar15] | 2);
    if (((*(ulong *)pObj & 0x1fffffff1fffffff) != 0x1fffffff1fffffff) && (pObj->Value == 0))
    goto LAB_00573265;
    uVar16 = (ulong)pObj->Value;
    if (p->nObjsFrame <= (int)pObj->Value) goto LAB_00573227;
    if (p->pCex->iFrame < 0) goto LAB_00573208;
    RVar3 = p->pObjs[uVar16];
    if (((uint)RVar3 & 4) == 0) {
      if (uVar16 == 0 && (*(ulong *)pObj & 0x1fffffff1fffffff) != 0x1fffffff1fffffff)
      goto LAB_00573265;
      p->pObjs[uVar16] = (Rnm_Obj_t)((uint)RVar3 | 4);
      p->nVisited = p->nVisited + 1;
    }
    if (((uint)pRVar6[(long)iVar11 + (ulong)uVar15] & 8) != 0) {
      if (((uint)pRVar6[(long)iVar11 + (ulong)uVar15] & 0xffffff0) == 0) {
        __assert_fail("(int)pRnm->Prio > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                      ,0x1e4,
                      "void Rnm_ManJustifyPropFanout_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)"
                     );
      }
      iVar11 = p->pCex->iFrame;
      if (-1 < iVar11) goto LAB_00573137;
      goto LAB_0057319f;
    }
    uVar16 = *(ulong *)pObj;
    uVar15 = (uint)uVar16;
    if (((uVar16 & 0x1fffffff) != 0x1fffffff && (int)uVar15 < 0) && (f == p->pCex->iFrame)) {
      return;
    }
    pGVar13 = p->pGia;
    iVar11 = (int)(uVar16 & 0x1fffffff);
    bVar8 = iVar11 == 0x1fffffff || -1 < (int)uVar15;
    uVar12 = (uint)(uVar16 >> 0x20);
    if (bVar8) break;
    if ((int)(uVar12 & 0x1fffffff) < pGVar13->vCos->nSize - pGVar13->nRegs) {
      return;
    }
    if ((bVar8) || ((int)(uVar12 & 0x1fffffff) < pGVar13->vCos->nSize - pGVar13->nRegs)) break;
    if (bVar8) {
LAB_00573284:
      __assert_fail("Gia_ObjIsRi(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1d0,"Gia_Obj_t *Gia_ObjRiToRo(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar11 = pGVar13->vCos->nSize;
    if ((int)(uVar12 & 0x1fffffff) < iVar11 - pGVar13->nRegs) goto LAB_00573284;
    iVar4 = pGVar13->vCis->nSize;
    uVar15 = (iVar4 - iVar11) + (uVar12 & 0x1fffffff);
    if (((int)uVar15 < 0) || (iVar4 <= (int)uVar15)) goto LAB_005731e9;
    iVar11 = pGVar13->vCis->pArray[uVar15];
    if (((long)iVar11 < 0) || (pGVar13->nObjs <= iVar11)) goto LAB_00573246;
    pObj = pGVar13->pObjs + iVar11;
    if (((~*(ulong *)pObj & 0x1fffffff1fffffff) != 0) && (pObj->Value == 0)) goto LAB_00573265;
    if (p->nObjsFrame <= (int)pObj->Value) goto LAB_00573227;
    if (p->pCex->iFrame <= f) goto LAB_00573208;
    f = f + 1;
    if (((uint)p->pObjs[(long)(p->nObjsFrame * f) + (ulong)pObj->Value] & 2) != 0) {
      return;
    }
  }
  if ((~uVar15 & 0x9fffffff) == 0) {
    if (((int)uVar15 < 0 || iVar11 == 0x1fffffff) &&
       ((int)(uVar12 & 0x1fffffff) < pGVar13->vCis->nSize - pGVar13->nRegs)) {
LAB_005732e1:
      __assert_fail("Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                    ,500,
                    "void Rnm_ManJustifyPropFanout_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)")
      ;
    }
  }
  else if (((int)uVar15 < 0) || (iVar11 == 0x1fffffff)) goto LAB_005732e1;
  pGVar13 = p->pGia;
  pGVar9 = pGVar13->pObjs;
  if (pGVar9 <= pObj) {
    iVar11 = 0;
    do {
      if (pGVar9 + pGVar13->nObjs <= pObj) break;
      uVar15 = (int)((long)pObj - (long)pGVar9 >> 2) * -0x55555555;
      if (((int)uVar15 < 0) || (pGVar13->vFanoutNums->nSize <= (int)uVar15)) {
LAB_005731e9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (pGVar13->vFanoutNums->pArray[uVar15 & 0x7fffffff] <= iVar11) {
        return;
      }
      iVar4 = pGVar13->vFanout->nSize;
      if (iVar4 <= (int)uVar15) goto LAB_005731e9;
      piVar7 = pGVar13->vFanout->pArray;
      uVar15 = piVar7[uVar15 & 0x7fffffff] + iVar11;
      if (((int)uVar15 < 0) || (iVar4 <= (int)uVar15)) goto LAB_005731e9;
      iVar4 = piVar7[uVar15];
      lVar14 = (long)iVar4;
      if ((lVar14 < 0) || (pGVar13->nObjs <= iVar4)) {
LAB_00573246:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar15 = pGVar9[lVar14].Value;
      if ((ulong)uVar15 != 0) {
        iVar4 = p->nObjsFrame;
        if (iVar4 <= (int)uVar15) goto LAB_00573227;
        if (p->pCex->iFrame < f) {
LAB_00573208:
          __assert_fail("f >= 0 && f <= p->pCex->iFrame",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.h"
                        ,0x61,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
        }
        iVar10 = iVar4 * f;
        pRVar6 = p->pObjs;
        if (((uint)pRVar6[(long)iVar10 + (ulong)uVar15] & 10) == 0) {
          pGVar9 = pGVar9 + lVar14;
          uVar16 = *(ulong *)pGVar9;
          uVar17 = uVar16 & 0x1fffffff;
          if (-1 < (int)uVar16 || uVar17 == 0x1fffffff) {
            if (((int)uVar16 < 0) || ((int)uVar17 == 0x1fffffff)) {
              __assert_fail("Gia_ObjIsAnd(pFanout)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                            ,0x202,
                            "void Rnm_ManJustifyPropFanout_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)"
                           );
            }
            pGVar1 = pGVar9 + -uVar17;
            if (((~*(ulong *)pGVar1 & 0x1fffffff1fffffff) != 0) && (pGVar1->Value == 0)) {
LAB_00573265:
              __assert_fail("Gia_ObjIsConst0(pObj) || pObj->Value",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.h"
                            ,0x5f,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
            }
            if (iVar4 <= (int)pGVar1->Value) {
LAB_00573227:
              __assert_fail("(int)pObj->Value < p->nObjsFrame",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.h"
                            ,0x60,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
            }
            uVar15 = (uint)(uVar16 >> 0x20);
            pGVar2 = pGVar9 + -(ulong)(uVar15 & 0x1fffffff);
            if (((~*(ulong *)pGVar2 & 0x1fffffff1fffffff) != 0) && (pGVar2->Value == 0))
            goto LAB_00573265;
            if (iVar4 <= (int)pGVar2->Value) goto LAB_00573227;
            RVar3 = pRVar6[(long)iVar10 + (ulong)pGVar1->Value];
            uVar12 = (uint)(uVar16 >> 0x1d) & 7 ^ (uint)RVar3;
            if ((((uint)RVar3 & 2) == 0) || ((uVar12 & 1) != 0)) {
              RVar5 = pRVar6[(long)iVar10 + (ulong)pGVar2->Value];
              uVar15 = uVar15 >> 0x1d ^ (uint)RVar5;
              if (((((uint)RVar5 & 2) == 0) || ((uVar15 & 1) != 0)) &&
                 ((((uint)RVar3 & (uint)RVar5 & 2) == 0 || ((uVar12 & uVar15 & 1) == 0))))
              goto LAB_005730ec;
            }
          }
          Rnm_ManJustifyPropFanout_rec(p,pGVar9,f,vSelect);
        }
      }
LAB_005730ec:
      iVar11 = iVar11 + 1;
      pGVar13 = p->pGia;
      pGVar9 = pGVar13->pObjs;
    } while (pGVar9 <= pObj);
  }
LAB_005730ff:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  while( true ) {
    if (p->nObjsFrame <= (int)pObj->Value) goto LAB_00573227;
    if (p->pCex->iFrame < iVar11) goto LAB_00573208;
    if (((uint)p->pObjs[(long)(p->nObjsFrame * iVar11) + (ulong)pObj->Value] & 2) == 0) {
      Rnm_ManJustifyPropFanout_rec(p,pObj,iVar11,vSelect);
    }
    bVar8 = iVar11 < 1;
    iVar11 = iVar11 + -1;
    if (bVar8) break;
LAB_00573137:
    if (((~*(ulong *)pObj & 0x1fffffff1fffffff) != 0) && (pObj->Value == 0)) goto LAB_00573265;
  }
LAB_0057319f:
  pGVar9 = p->pGia->pObjs;
  if ((pGVar9 <= pObj) && (pObj < pGVar9 + p->pGia->nObjs)) {
    Vec_IntPush(vSelect,(int)((ulong)((long)pObj - (long)pGVar9) >> 2) * -0x55555555);
    return;
  }
  goto LAB_005730ff;
}

Assistant:

void Rnm_ManJustifyPropFanout_rec( Rnm_Man_t * p, Gia_Obj_t * pObj, int f, Vec_Int_t * vSelect )
{
    Rnm_Obj_t * pRnm0, * pRnm1, * pRnm = Rnm_ManObj( p, pObj, f );
    Gia_Obj_t * pFanout = NULL;
    int i, k;//, Id = Gia_ObjId(p->pGia, pObj);
    assert( pRnm->fVisit == 0 );
    pRnm->fVisit = 1;
    if ( Rnm_ManObj( p, pObj, 0 )->fVisitJ == 0 )
    {
        Rnm_ManObj( p, pObj, 0 )->fVisitJ = 1;
        p->nVisited++;
    }
    if ( pRnm->fPPi )
    {
        assert( (int)pRnm->Prio > 0 );
        for ( i = p->pCex->iFrame; i >= 0; i-- )
            if ( !Rnm_ManObj(p, pObj, i)->fVisit )
                Rnm_ManJustifyPropFanout_rec( p, pObj, i, vSelect );
        Vec_IntPush( vSelect, Gia_ObjId(p->pGia, pObj) );
        return;
    }
    if ( (Gia_ObjIsCo(pObj) && f == p->pCex->iFrame) || Gia_ObjIsPo(p->pGia, pObj) )
        return;
    if ( Gia_ObjIsRi(p->pGia, pObj) )
    {
        pFanout = Gia_ObjRiToRo(p->pGia, pObj);
        if ( !Rnm_ManObj(p, pFanout, f+1)->fVisit )
            Rnm_ManJustifyPropFanout_rec( p, pFanout, f+1, vSelect );
        return;
    }
    assert( Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj) );
    Gia_ObjForEachFanoutStatic( p->pGia, pObj, pFanout, k )
    {
        Rnm_Obj_t * pRnmF;
        if ( pFanout->Value == 0 )
            continue;
        pRnmF = Rnm_ManObj(p, pFanout, f);
        if ( pRnmF->fPPi || pRnmF->fVisit )
            continue;
        if ( Gia_ObjIsCo(pFanout) )
        {
            Rnm_ManJustifyPropFanout_rec( p, pFanout, f, vSelect );
            continue;
        } 
        assert( Gia_ObjIsAnd(pFanout) );
        pRnm0 = Rnm_ManObj( p, Gia_ObjFanin0(pFanout), f );
        pRnm1 = Rnm_ManObj( p, Gia_ObjFanin1(pFanout), f );
        if ( ((pRnm0->Value ^ Gia_ObjFaninC0(pFanout)) == 0 && pRnm0->fVisit) ||
             ((pRnm1->Value ^ Gia_ObjFaninC1(pFanout)) == 0 && pRnm1->fVisit) || 
           ( ((pRnm0->Value ^ Gia_ObjFaninC0(pFanout)) == 1 && pRnm0->fVisit) && 
             ((pRnm1->Value ^ Gia_ObjFaninC1(pFanout)) == 1 && pRnm1->fVisit) ) )
           Rnm_ManJustifyPropFanout_rec( p, pFanout, f, vSelect );
    }
}